

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O1

size_t libcellml::getComponentIndexInComponentEntity
                 (ComponentEntityPtr *componentParent,ComponentEntityPtr *component)

{
  element_type *peVar1;
  _func_int **pp_Var2;
  size_t sVar3;
  bool bVar4;
  bool bVar5;
  ComponentEntity local_40;
  
  bVar4 = false;
  sVar3 = 0;
  do {
    ComponentEntity::component
              (&local_40,
               (size_t)(componentParent->
                       super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr);
    pp_Var2 = local_40.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity;
    peVar1 = (component->super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>)
             ._M_ptr;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_40.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_40.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl);
    }
    bVar5 = (element_type *)pp_Var2 != peVar1;
    if (!bVar5) {
      bVar4 = true;
    }
    sVar3 = sVar3 + bVar5;
  } while (!bVar4);
  return sVar3;
}

Assistant:

size_t getComponentIndexInComponentEntity(const ComponentEntityPtr &componentParent, const ComponentEntityPtr &component)
{
    size_t index = 0;
    bool found = false;
    while (!found) {
        if (componentParent->component(index) == component) {
            found = true;
        } else {
            ++index;
        }
    }

    return index;
}